

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int32_t zng_inflateGetHeader(zng_stream *strm,zng_gz_headerp head)

{
  int iVar1;
  int32_t iVar2;
  
  iVar1 = inflateStateCheck(strm);
  iVar2 = -2;
  if ((iVar1 == 0) && (((ulong)strm->state->pending_out & 2) != 0)) {
    *(zng_gz_headerp *)&strm->state->status = head;
    head->done = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateGetHeader)(PREFIX3(stream) *strm, PREFIX(gz_headerp) head) {
    struct inflate_state *state;

    /* check state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if ((state->wrap & 2) == 0)
        return Z_STREAM_ERROR;

    /* save header structure */
    state->head = head;
    head->done = 0;
    return Z_OK;
}